

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O2

VRMatrix4 *
MinVR::VRMatrix4::rotation(VRMatrix4 *__return_storage_ptr__,VRPoint3 *p,VRVector3 *v,float a)

{
  float __y;
  float radians;
  float fVar1;
  VRMatrix4 A;
  VRMatrix4 B;
  VRMatrix4 transBack;
  VRMatrix4 invB;
  VRMatrix4 invA;
  VRMatrix4 C;
  VRMatrix4 transToOrigin;
  VRMatrix4 local_378;
  VRMatrix4 local_330;
  VRMatrix4 local_2e8;
  VRMatrix4 local_2a0;
  VRMatrix4 local_258;
  VRMatrix4 local_210;
  VRMatrix4 local_1c8;
  VRMatrix4 local_180;
  VRMatrix4 local_138;
  VRMatrix4 local_f0;
  VRMatrix4 local_a8;
  VRMatrix4 local_60;
  
  fVar1 = v->x;
  __y = v->z;
  radians = atan2f(__y,fVar1);
  fVar1 = atan2f(v->y,SQRT(fVar1 * fVar1 + __y * __y));
  VRVector3::VRVector3((VRVector3 *)&local_2e8,p->x,p->y,p->z);
  VRVector3::VRVector3((VRVector3 *)&local_330,-local_2e8.m[0],-local_2e8.m[1],-local_2e8.m[2]);
  translation(&local_60,(VRVector3 *)&local_330);
  VRVector3::~VRVector3((VRVector3 *)&local_330);
  VRVector3::~VRVector3((VRVector3 *)&local_2e8);
  rotationY(&local_330,radians);
  rotationZ(&local_2e8,-fVar1);
  rotationX(&local_a8,a);
  rotationY(&local_f0,-radians);
  rotationZ(&local_138,fVar1);
  VRVector3::VRVector3((VRVector3 *)&local_378,p->x,p->y,p->z);
  translation(&local_180,(VRVector3 *)&local_378);
  VRVector3::~VRVector3((VRVector3 *)&local_378);
  operator*(&local_2a0,&local_180,&local_f0);
  operator*(&local_258,&local_2a0,&local_138);
  operator*(&local_210,&local_258,&local_a8);
  operator*(&local_1c8,&local_210,&local_2e8);
  operator*(&local_378,&local_1c8,&local_330);
  operator*(__return_storage_ptr__,&local_378,&local_60);
  ~VRMatrix4(&local_378);
  ~VRMatrix4(&local_1c8);
  ~VRMatrix4(&local_210);
  ~VRMatrix4(&local_258);
  ~VRMatrix4(&local_2a0);
  ~VRMatrix4(&local_180);
  ~VRMatrix4(&local_138);
  ~VRMatrix4(&local_f0);
  ~VRMatrix4(&local_a8);
  ~VRMatrix4(&local_2e8);
  ~VRMatrix4(&local_330);
  ~VRMatrix4(&local_60);
  return __return_storage_ptr__;
}

Assistant:

VRMatrix4 VRMatrix4::rotation(const VRPoint3& p, const VRVector3& v, const float a) {
  // Translate to origin from point p
  const float vZ = v[2];
  const float vX = v[0];
  const float theta = atan2(vZ, vX);
  const float phi   = -atan2((float)v[1], (float)sqrt(vX * vX + vZ * vZ));

  const VRMatrix4 transToOrigin = VRMatrix4::translation(-1.0*VRVector3(p[0], p[1], p[2]));
  const VRMatrix4 A = VRMatrix4::rotationY(theta);
  const VRMatrix4 B = VRMatrix4::rotationZ(phi);
  const VRMatrix4 C = VRMatrix4::rotationX(a);
  const VRMatrix4 invA = VRMatrix4::rotationY(-theta);
  const VRMatrix4 invB = VRMatrix4::rotationZ(-phi);
  const VRMatrix4 transBack = VRMatrix4::translation(VRVector3(p[0], p[1], p[2]));
  
  return transBack * invA * invB * C * B * A * transToOrigin;
}